

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_algo_struct.c
# Opt level: O1

void pl_computePhnHeur(mdef_t *md,ascr_t *a,pl_t *pl,int32 heutype,int32 win_strt,int32 win_efv)

{
  short sVar1;
  short sVar2;
  int32 *piVar3;
  short *psVar4;
  s3cipid_t *psVar5;
  int32 *piVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int32 iVar16;
  
  iVar12 = md->n_emit_state;
  piVar3 = pl->phn_heur_list;
  psVar4 = md->cd2cisen;
  if (*psVar4 == 0) {
    psVar5 = md->sen2cimap;
    uVar11 = 0;
    do {
      piVar3[psVar5[uVar11]] = 0;
      lVar10 = uVar11 + 1;
      uVar11 = uVar11 + 1;
    } while (uVar11 == (uint)(int)psVar4[lVar10]);
  }
  if (heutype == 1) {
    if (win_strt < win_efv) {
      sVar1 = *psVar4;
      lVar10 = (long)win_strt;
      do {
        if (sVar1 == 0) {
          piVar6 = a->cache_ci_senscr[lVar10];
          psVar5 = md->sen2cimap;
          uVar15 = 0x80000000;
          uVar11 = 0;
          do {
            uVar9 = piVar6[uVar11];
            if (piVar6[uVar11] < (int)uVar15) {
              uVar9 = uVar15;
            }
            sVar2 = psVar5[uVar11];
            uVar15 = uVar9;
            if (sVar2 != psVar5[uVar11 + 1]) {
              iVar12 = piVar3[sVar2] + uVar9;
              uVar15 = 0x80000000;
              iVar16 = iVar12;
              if ((int)(piVar3[sVar2] & uVar9) < 0) {
                iVar16 = -0x80000000;
              }
              if (iVar12 < 1) {
                iVar16 = iVar12;
              }
              piVar3[sVar2] = iVar16;
            }
            lVar7 = uVar11 + 1;
            uVar11 = uVar11 + 1;
          } while (uVar11 == (uint)(int)psVar4[lVar7]);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != win_efv);
    }
  }
  else if (heutype == 2) {
    if (win_strt < win_efv) {
      sVar1 = *psVar4;
      lVar10 = (long)win_strt;
      do {
        if (sVar1 == 0) {
          piVar6 = a->cache_ci_senscr[lVar10];
          psVar5 = md->sen2cimap;
          uVar15 = 0x80000000;
          uVar11 = 0;
          do {
            uVar9 = piVar6[uVar11] + uVar15;
            uVar8 = uVar9;
            if ((int)(piVar6[uVar11] & uVar15) < 0) {
              uVar8 = 0x80000000;
            }
            uVar15 = uVar8;
            if ((int)uVar9 < 1) {
              uVar15 = uVar9;
            }
            sVar2 = psVar5[uVar11];
            if (sVar2 != psVar5[uVar11 + 1]) {
              uVar9 = (int)uVar15 / iVar12;
              iVar14 = piVar3[sVar2] + uVar9;
              uVar15 = 0x80000000;
              iVar13 = -0x80000000;
              if (-1 < (int)(piVar3[sVar2] & uVar9)) {
                iVar13 = iVar14;
              }
              if (iVar14 < 1) {
                iVar13 = iVar14;
              }
              piVar3[sVar2] = iVar13;
            }
            lVar7 = uVar11 + 1;
            uVar11 = uVar11 + 1;
          } while (uVar11 == (uint)(int)psVar4[lVar7]);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != win_efv);
    }
  }
  else if ((heutype == 3) && (win_strt < win_efv)) {
    sVar1 = *psVar4;
    lVar10 = (long)win_strt;
    do {
      if (sVar1 == 0) {
        psVar5 = md->sen2cimap;
        piVar6 = a->cache_ci_senscr[lVar10];
        uVar11 = 0;
        uVar15 = 0x80000000;
        iVar12 = 0;
        do {
          if ((iVar12 == 0) || (iVar12 != md->sen2cimap[uVar11 - 1])) {
            iVar14 = piVar3[iVar12] + a->cache_ci_senscr[lVar10][uVar11];
            iVar13 = iVar14;
            if ((a->cache_ci_senscr[lVar10][uVar11] & piVar3[iVar12]) < 0) {
              iVar13 = -0x80000000;
            }
            if (iVar14 < 1) {
              iVar13 = iVar14;
            }
            piVar3[iVar12] = iVar13;
          }
          sVar2 = psVar5[uVar11];
          iVar12 = (int)sVar2;
          uVar9 = piVar6[uVar11];
          if (piVar6[uVar11] < (int)uVar15) {
            uVar9 = uVar15;
          }
          uVar15 = uVar9;
          if (sVar2 != psVar5[uVar11 + 1]) {
            iVar14 = piVar3[iVar12] + uVar9;
            uVar15 = 0x80000000;
            iVar16 = iVar14;
            if ((int)(piVar3[iVar12] & uVar9) < 0) {
              iVar16 = -0x80000000;
            }
            if (iVar14 < 1) {
              iVar16 = iVar14;
            }
            piVar3[iVar12] = iVar16;
          }
          lVar7 = uVar11 + 1;
          uVar11 = uVar11 + 1;
        } while (uVar11 == (uint)(int)psVar4[lVar7]);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != win_efv);
  }
  return;
}

Assistant:

void
pl_computePhnHeur(mdef_t * md, ascr_t * a, pl_t * pl, int32 heutype,
                  int32 win_strt, int32 win_efv)
{
    int32 nState;
    int32 i, j;
    int32 curPhn, curFrmPhnVar; /* variables for phoneme lookahead computation */
    int32 *ph_lst;

    nState = mdef_n_emit_state(md);
    ph_lst = pl->phn_heur_list;

    /* Initializing all the phoneme heuristics for each phone to be 0 */
    for (j = 0; j == md->cd2cisen[j]; j++) {
        curPhn = md->sen2cimap[j];      /*Just to save a warning */
        ph_lst[curPhn] = 0;
    }

    /* 20040503: ARCHAN, the code can be reduced to 10 lines, it is so
       organized such that there is no overhead in checking the
       heuristic type in the inner loop.  
     */
    /* One trick we use is to use sen2cimap to check phoneme ending boundary */


    if (heutype == 1) {         /* Taking Max */
        for (i = win_strt; i < win_efv; i++) {
            curPhn = 0;
            curFrmPhnVar = MAX_NEG_INT32;
            for (j = 0; j == md->cd2cisen[j]; j++) {
                if (curFrmPhnVar < a->cache_ci_senscr[i][j])
                    curFrmPhnVar = a->cache_ci_senscr[i][j];

                curPhn = md->sen2cimap[j];
                /* Update at the phone_end boundary */
                if (curPhn != md->sen2cimap[j + 1]) {
                    ph_lst[curPhn] =
                        NO_UFLOW_ADD(ph_lst[curPhn], curFrmPhnVar);
                    curFrmPhnVar = MAX_NEG_INT32;
                }
            }
        }
    }
    else if (heutype == 2) {
        for (i = win_strt; i < win_efv; i++) {
            curPhn = 0;
            curFrmPhnVar = MAX_NEG_INT32;
            for (j = 0; j == md->cd2cisen[j]; j++) {
                curFrmPhnVar =
                    NO_UFLOW_ADD(a->cache_ci_senscr[i][j], curFrmPhnVar);
                curPhn = md->sen2cimap[j];

                /* Update at the phone_end boundary */
                if (curPhn != md->sen2cimap[j + 1]) {
                    curFrmPhnVar /= nState;     /* ARCHAN: I hate to do division ! */
                    ph_lst[curPhn] =
                        NO_UFLOW_ADD(ph_lst[curPhn], curFrmPhnVar);
                    curFrmPhnVar = MAX_NEG_INT32;
                }
            }
        }
    }
    else if (heutype == 3) {
        for (i = win_strt; i < win_efv; i++) {
            curPhn = 0;
            curFrmPhnVar = MAX_NEG_INT32;
            for (j = 0; j == md->cd2cisen[j]; j++) {
                if (curPhn == 0 || curPhn != md->sen2cimap[j - 1])      /* dangerous hack! */
                    ph_lst[curPhn] =
                        NO_UFLOW_ADD(ph_lst[curPhn],
                                     a->cache_ci_senscr[i][j]);

                curPhn = md->sen2cimap[j];

                if (curFrmPhnVar < a->cache_ci_senscr[i][j])
                    curFrmPhnVar = a->cache_ci_senscr[i][j];

                /* Update at the phone_end boundary */
                if (md->sen2cimap[j] != md->sen2cimap[j + 1]) {
                    ph_lst[curPhn] =
                        NO_UFLOW_ADD(ph_lst[curPhn], curFrmPhnVar);
                    curFrmPhnVar = MAX_NEG_INT32;
                }
            }
        }
    }

#if 0
    for (j = 0; j == md->cd2cisen[j]; j++) {
        curPhn = md->cd2cisen[j];
        E_INFO("phoneme heuristics scores at phn %d is %d\n", j,
               kb->phn_list[mdef->sen2cimap[j]]);
    }
#endif


}